

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestCoverageHandler::ParseBullsEyeCovsrcLine
          (cmCTestCoverageHandler *this,string *inputLine,string *sourceFile,int *functionsCalled,
          int *totalFunctions,int *percentFunction,int *branchCovered,int *totalBranches,
          int *percentBranch)

{
  cmCTest *pcVar1;
  size_type sVar2;
  ostream *poVar3;
  cmCTestCoverageHandler *this_00;
  size_type pos;
  ostringstream cmCTestLog_msg;
  long *local_1d0;
  long local_1c0 [2];
  size_type local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  sVar2 = std::__cxx11::string::find((char)inputLine,0x2c);
  local_1b0 = sVar2;
  if (sVar2 == 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error parsing string : ",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(inputLine->_M_dataplus)._M_p,
                        inputLine->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x885,(char *)local_1d0,false);
  }
  else {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)inputLine);
    std::__cxx11::string::operator=((string *)sourceFile,(string *)local_1a8);
    this_00 = (cmCTestCoverageHandler *)local_1a8._0_8_;
    if ((cmCTestCoverageHandler *)local_1a8._0_8_ != (cmCTestCoverageHandler *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      this_00 = (cmCTestCoverageHandler *)local_1a8._0_8_;
    }
    local_1b0 = sVar2 + 1;
    GetNextInt(this_00,inputLine,&local_1b0,functionsCalled);
    GetNextInt(this_00,inputLine,&local_1b0,totalFunctions);
    GetNextInt(this_00,inputLine,&local_1b0,percentFunction);
    GetNextInt(this_00,inputLine,&local_1b0,branchCovered);
    GetNextInt(this_00,inputLine,&local_1b0,totalBranches);
    GetNextInt(this_00,inputLine,&local_1b0,percentBranch);
    if (local_1b0 == 0xffffffffffffffff) goto LAB_0017daf2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error parsing input : ",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(inputLine->_M_dataplus)._M_p,
                        inputLine->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," last pos not npos =  ",0x16);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x8a1,(char *)local_1d0,false);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
LAB_0017daf2:
  return sVar2 != 0xffffffffffffffff;
}

Assistant:

bool cmCTestCoverageHandler::ParseBullsEyeCovsrcLine(
  std::string const& inputLine, std::string& sourceFile, int& functionsCalled,
  int& totalFunctions, int& percentFunction, int& branchCovered,
  int& totalBranches, int& percentBranch)
{
  // find the first comma
  std::string::size_type pos = inputLine.find(',');
  if (pos == std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing string : " << inputLine << "\n");
    return false;
  }
  // the source file has "" around it so extract out the file name
  sourceFile = inputLine.substr(1, pos - 2);
  pos++;
  if (!this->GetNextInt(inputLine, pos, functionsCalled)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalFunctions)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentFunction)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, branchCovered)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalBranches)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentBranch)) {
    return false;
  }
  // should be at the end now
  if (pos != std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing input : "
                 << inputLine << " last pos not npos =  " << pos << "\n");
  }
  return true;
}